

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LimitBoneWeightsProcess.cpp
# Opt level: O0

void __thiscall
Assimp::LimitBoneWeightsProcess::ProcessMesh(LimitBoneWeightsProcess *this,aiMesh *pMesh)

{
  uint uVar1;
  void *__dest;
  aiBone *this_00;
  float fVar2;
  int iVar3;
  bool bVar4;
  const_reference cVar5;
  reference this_01;
  pointer pvVar6;
  pointer pvVar7;
  pointer pWVar8;
  ulong uVar9;
  size_type sVar10;
  pointer pWVar11;
  reference this_02;
  const_reference __src;
  Logger *this_03;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar12;
  basic_formatter *this_04;
  reference rVar13;
  iterator iVar14;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_218;
  _Bit_type *local_1f8;
  uint local_1f0;
  _Bit_iterator_base local_1e8;
  _Bit_type *local_1d8;
  uint local_1d0;
  _Bit_iterator local_1c8;
  undefined1 local_1b8 [8];
  const_iterator iter;
  aiBone **ppcSrc;
  aiBone **ppcCur;
  _Bit_type local_190;
  Weight local_188;
  aiBone *bone_1;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *bw;
  uint a_2;
  vector<bool,_std::allocator<bool>_> abNoNeed;
  __normal_iterator<const_Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
  local_140;
  __normal_iterator<const_Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
  local_138;
  const_iterator it_2;
  vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
  *vw;
  uint a_1;
  WeightsPerBone boneWeights;
  __normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
  local_100;
  iterator it_1;
  iterator iStack_f0;
  float invSum;
  __normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
  local_e8;
  __normal_iterator<const_Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
  local_e0;
  const_iterator it;
  float sum;
  __normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
  local_c8;
  const_iterator local_c0;
  __normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
  local_b8;
  __normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
  local_b0;
  const_iterator local_a8;
  int local_9c;
  iterator iStack_98;
  uint m;
  __normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
  local_90;
  __normal_iterator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_*,_std::vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>_>
  local_88;
  __normal_iterator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_*,_std::vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>_>
  local_80;
  iterator vit;
  uint local_70;
  uint uStack_6c;
  bool bChanged;
  uint old_bones;
  uint removed;
  uint *local_60;
  aiVertexWeight *w;
  Weight WStack_50;
  uint b;
  aiBone *bone;
  uint a;
  allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
  local_31;
  undefined1 local_30 [8];
  WeightsPerVertex vertexWeights;
  aiMesh *pMesh_local;
  LimitBoneWeightsProcess *this_local;
  
  vertexWeights.
  super__Vector_base<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pMesh;
  bVar4 = aiMesh::HasBones(pMesh);
  if (bVar4) {
    uVar1 = *(uint *)((long)&((vertexWeights.
                               super__Vector_base<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                             super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                             )._M_impl.super__Vector_impl_data._M_start + 4);
    std::
    allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
    ::allocator(&local_31);
    std::
    vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
    ::vector((vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
              *)local_30,(ulong)uVar1,&local_31);
    std::
    allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
    ::~allocator(&local_31);
    for (bone._0_4_ = 0;
        (uint)bone <
        *(uint *)&vertexWeights.
                  super__Vector_base<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
                  super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                  ._M_impl.super__Vector_impl_data._M_start; bone._0_4_ = (uint)bone + 1) {
      WStack_50 = vertexWeights.
                  super__Vector_base<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
                  super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                  ._M_impl.super__Vector_impl_data._M_finish[(uint)bone];
      for (w._4_4_ = 0; w._4_4_ < *(uint *)((long)WStack_50 + 0x404); w._4_4_ = w._4_4_ + 1) {
        local_60 = (uint *)(*(long *)((long)WStack_50 + 0x408) + (ulong)w._4_4_ * 8);
        this_01 = std::
                  vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                  ::operator[]((vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                                *)local_30,(ulong)*local_60);
        Weight::Weight((Weight *)&old_bones,(uint)bone,(float)local_60[1]);
        std::
        vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
        ::push_back(this_01,(value_type *)&old_bones);
      }
    }
    uStack_6c = 0;
    local_70 = *(uint *)&vertexWeights.
                         super__Vector_base<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
                         super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    vit._M_current._7_1_ = 0;
    local_80._M_current =
         (vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
          *)std::
            vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
            ::begin((vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                     *)local_30);
    while( true ) {
      local_88._M_current =
           (vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
            *)std::
              vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
              ::end((vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                     *)local_30);
      bVar4 = __gnu_cxx::operator!=(&local_80,&local_88);
      if (!bVar4) break;
      pvVar6 = __gnu_cxx::
               __normal_iterator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_*,_std::vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>_>
               ::operator->(&local_80);
      sVar10 = std::
               vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
               ::size(pvVar6);
      if (this->mMaxWeights < sVar10) {
        vit._M_current._7_1_ = 1;
        pvVar6 = __gnu_cxx::
                 __normal_iterator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_*,_std::vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>_>
                 ::operator->(&local_80);
        local_90._M_current =
             (Weight *)
             std::
             vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
             ::begin(pvVar6);
        pvVar6 = __gnu_cxx::
                 __normal_iterator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_*,_std::vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>_>
                 ::operator->(&local_80);
        iStack_98 = std::
                    vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                    ::end(pvVar6);
        std::
        sort<__gnu_cxx::__normal_iterator<Assimp::LimitBoneWeightsProcess::Weight*,std::vector<Assimp::LimitBoneWeightsProcess::Weight,std::allocator<Assimp::LimitBoneWeightsProcess::Weight>>>>
                  (local_90,(__normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
                             )iStack_98._M_current);
        pvVar6 = __gnu_cxx::
                 __normal_iterator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_*,_std::vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>_>
                 ::operator->(&local_80);
        sVar10 = std::
                 vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                 ::size(pvVar6);
        local_9c = (int)sVar10;
        pvVar6 = __gnu_cxx::
                 __normal_iterator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_*,_std::vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>_>
                 ::operator->(&local_80);
        pvVar7 = __gnu_cxx::
                 __normal_iterator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_*,_std::vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>_>
                 ::operator->(&local_80);
        local_b8._M_current =
             (Weight *)
             std::
             vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
             ::begin(pvVar7);
        local_b0 = __gnu_cxx::
                   __normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
                   ::operator+(&local_b8,(ulong)this->mMaxWeights);
        __gnu_cxx::
        __normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_const*,std::vector<Assimp::LimitBoneWeightsProcess::Weight,std::allocator<Assimp::LimitBoneWeightsProcess::Weight>>>
        ::__normal_iterator<Assimp::LimitBoneWeightsProcess::Weight*>
                  ((__normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_const*,std::vector<Assimp::LimitBoneWeightsProcess::Weight,std::allocator<Assimp::LimitBoneWeightsProcess::Weight>>>
                    *)&local_a8,&local_b0);
        pvVar7 = __gnu_cxx::
                 __normal_iterator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_*,_std::vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>_>
                 ::operator->(&local_80);
        local_c8._M_current =
             (Weight *)
             std::
             vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
             ::end(pvVar7);
        __gnu_cxx::
        __normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_const*,std::vector<Assimp::LimitBoneWeightsProcess::Weight,std::allocator<Assimp::LimitBoneWeightsProcess::Weight>>>
        ::__normal_iterator<Assimp::LimitBoneWeightsProcess::Weight*>
                  ((__normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_const*,std::vector<Assimp::LimitBoneWeightsProcess::Weight,std::allocator<Assimp::LimitBoneWeightsProcess::Weight>>>
                    *)&local_c0,&local_c8);
        std::
        vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
        ::erase(pvVar6,local_a8,local_c0);
        iVar3 = local_9c;
        pvVar6 = __gnu_cxx::
                 __normal_iterator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_*,_std::vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>_>
                 ::operator->(&local_80);
        sVar10 = std::
                 vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                 ::size(pvVar6);
        uStack_6c = (iVar3 - (int)sVar10) + uStack_6c;
        it._M_current._4_4_ = 0.0;
        pvVar6 = __gnu_cxx::
                 __normal_iterator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_*,_std::vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>_>
                 ::operator->(&local_80);
        local_e8._M_current =
             (Weight *)
             std::
             vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
             ::begin(pvVar6);
        __gnu_cxx::
        __normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_const*,std::vector<Assimp::LimitBoneWeightsProcess::Weight,std::allocator<Assimp::LimitBoneWeightsProcess::Weight>>>
        ::__normal_iterator<Assimp::LimitBoneWeightsProcess::Weight*>
                  ((__normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_const*,std::vector<Assimp::LimitBoneWeightsProcess::Weight,std::allocator<Assimp::LimitBoneWeightsProcess::Weight>>>
                    *)&local_e0,&local_e8);
        while( true ) {
          pvVar6 = __gnu_cxx::
                   __normal_iterator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_*,_std::vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>_>
                   ::operator->(&local_80);
          iStack_f0 = std::
                      vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                      ::end(pvVar6);
          bVar4 = __gnu_cxx::operator!=(&local_e0,&stack0xffffffffffffff10);
          if (!bVar4) break;
          pWVar11 = __gnu_cxx::
                    __normal_iterator<const_Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
                    ::operator->(&local_e0);
          it._M_current._4_4_ = pWVar11->mWeight + it._M_current._4_4_;
          __gnu_cxx::
          __normal_iterator<const_Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
          ::operator++(&local_e0);
        }
        if ((it._M_current._4_4_ != 0.0) || (NAN(it._M_current._4_4_))) {
          it_1._M_current._4_4_ = 1.0 / it._M_current._4_4_;
          pvVar6 = __gnu_cxx::
                   __normal_iterator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_*,_std::vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>_>
                   ::operator->(&local_80);
          local_100._M_current =
               (Weight *)
               std::
               vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
               ::begin(pvVar6);
          while( true ) {
            pvVar6 = __gnu_cxx::
                     __normal_iterator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_*,_std::vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>_>
                     ::operator->(&local_80);
            boneWeights.
            super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)std::
                          vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                          ::end(pvVar6);
            bVar4 = __gnu_cxx::operator!=
                              (&local_100,
                               (__normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
                                *)&boneWeights.
                                   super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
            fVar2 = it_1._M_current._4_4_;
            if (!bVar4) break;
            pWVar8 = __gnu_cxx::
                     __normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
                     ::operator->(&local_100);
            pWVar8->mWeight = fVar2 * pWVar8->mWeight;
            __gnu_cxx::
            __normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
            ::operator++(&local_100);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_*,_std::vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>_>
      ::operator++(&local_80);
    }
    if ((vit._M_current._7_1_ & 1) != 0) {
      uVar1 = *(uint *)&vertexWeights.
                        super__Vector_base<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
                        super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>::allocator
                ((allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_> *)
                 ((long)&vw + 7));
      std::
      vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
      ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                *)&a_1,(ulong)uVar1,
               (allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_> *)
               ((long)&vw + 7));
      std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>::~allocator
                ((allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_> *)
                 ((long)&vw + 7));
      for (vw._0_4_ = 0; uVar9 = (ulong)(uint)vw,
          sVar10 = std::
                   vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                   ::size((vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                           *)local_30), uVar9 < sVar10; vw._0_4_ = (uint)vw + 1) {
        it_2._M_current =
             (Weight *)
             std::
             vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
             ::operator[]((vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                           *)local_30,(ulong)(uint)vw);
        local_138._M_current =
             (Weight *)
             std::
             vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
             ::begin((vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                      *)it_2._M_current);
        while( true ) {
          local_140._M_current =
               (Weight *)
               std::
               vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
               ::end(it_2._M_current);
          bVar4 = __gnu_cxx::operator!=(&local_138,&local_140);
          if (!bVar4) break;
          pWVar11 = __gnu_cxx::
                    __normal_iterator<const_Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
                    ::operator->(&local_138);
          this_02 = std::
                    vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                    ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                  *)&a_1,(ulong)pWVar11->mBone);
          uVar1 = (uint)vw;
          pWVar11 = __gnu_cxx::
                    __normal_iterator<const_Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
                    ::operator->(&local_138);
          aiVertexWeight::aiVertexWeight
                    ((aiVertexWeight *)
                     &abNoNeed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage,uVar1,pWVar11->mWeight);
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back
                    (this_02,(value_type *)
                             &abNoNeed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage);
          __gnu_cxx::
          __normal_iterator<const_Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
          ::operator++(&local_138);
        }
      }
      uVar1 = *(uint *)&vertexWeights.
                        super__Vector_base<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
                        super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      bw._7_1_ = 0;
      std::allocator<bool>::allocator((allocator<bool> *)((long)&bw + 6));
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&a_2,(ulong)uVar1,(bool *)((long)&bw + 7),
                 (allocator<bool> *)((long)&bw + 6));
      std::allocator<bool>::~allocator((allocator<bool> *)((long)&bw + 6));
      vit._M_current._7_1_ = 0;
      for (bw._0_4_ = 0;
          (uint)bw <
          *(uint *)&vertexWeights.
                    super__Vector_base<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
                    super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                    ._M_impl.super__Vector_impl_data._M_start; bw._0_4_ = (uint)bw + 1) {
        bone_1 = (aiBone *)
                 std::
                 vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                 ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                               *)&a_1,(ulong)(uint)bw);
        local_188 = vertexWeights.
                    super__Vector_base<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
                    super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                    ._M_impl.super__Vector_impl_data._M_finish[(uint)bw];
        bVar4 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::empty
                          ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)bone_1);
        if (bVar4) {
          vit._M_current._7_1_ = 1;
          rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)&a_2,(ulong)(uint)bw);
          local_190 = rVar13._M_mask;
          ppcCur = (aiBone **)rVar13._M_p;
          std::_Bit_reference::operator=((_Bit_reference *)&ppcCur,true);
        }
        else {
          sVar10 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size
                             ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)bone_1);
          if (*(uint *)((long)local_188 + 0x404) < sVar10) {
            __assert_fail("bw.size() <= bone->mNumWeights",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/LimitBoneWeightsProcess.cpp"
                          ,0xb2,"void Assimp::LimitBoneWeightsProcess::ProcessMesh(aiMesh *)");
          }
          sVar10 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size
                             ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)bone_1);
          *(int *)((long)local_188 + 0x404) = (int)sVar10;
          __dest = *(void **)((long)local_188 + 0x408);
          __src = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::operator[]
                            ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)bone_1,0);
          sVar10 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size
                             ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)bone_1);
          memcpy(__dest,__src,sVar10 << 3);
        }
      }
      if ((vit._M_current._7_1_ & 1) != 0) {
        ppcSrc = (aiBone **)
                 vertexWeights.
                 super__Vector_base<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
                 super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        iter.super__Bit_iterator_base._8_8_ = ppcSrc;
        iVar14 = std::vector<bool,_std::allocator<bool>_>::begin
                           ((vector<bool,_std::allocator<bool>_> *)&a_2);
        local_1d8 = iVar14.super__Bit_iterator_base._M_p;
        local_1d0 = iVar14.super__Bit_iterator_base._M_offset;
        local_1c8.super__Bit_iterator_base._M_p = local_1d8;
        local_1c8.super__Bit_iterator_base._M_offset = local_1d0;
        std::_Bit_const_iterator::_Bit_const_iterator((_Bit_const_iterator *)local_1b8,&local_1c8);
        while( true ) {
          iVar14 = std::vector<bool,_std::allocator<bool>_>::end
                             ((vector<bool,_std::allocator<bool>_> *)&a_2);
          local_1f8 = iVar14.super__Bit_iterator_base._M_p;
          local_1f0 = iVar14.super__Bit_iterator_base._M_offset;
          local_1e8._M_p = local_1f8;
          local_1e8._M_offset = local_1f0;
          bVar4 = std::operator!=((_Bit_iterator_base *)local_1b8,&local_1e8);
          if (!bVar4) break;
          cVar5 = std::_Bit_const_iterator::operator*((_Bit_const_iterator *)local_1b8);
          if (cVar5) {
            this_00 = *(aiBone **)iter.super__Bit_iterator_base._8_8_;
            if (this_00 != (aiBone *)0x0) {
              aiBone::~aiBone(this_00);
              operator_delete(this_00,0x450);
            }
            *(int *)&vertexWeights.
                     super__Vector_base<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
                     super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                     ._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&vertexWeights.
                          super__Vector_base<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
                          super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                          ._M_impl.super__Vector_impl_data._M_start + -1;
          }
          else {
            *ppcSrc = *(aiBone **)iter.super__Bit_iterator_base._8_8_;
            ppcSrc = ppcSrc + 1;
          }
          iter.super__Bit_iterator_base._8_8_ = iter.super__Bit_iterator_base._8_8_ + 8;
          std::_Bit_const_iterator::operator++((_Bit_const_iterator *)local_1b8);
        }
      }
      bVar4 = DefaultLogger::isNullLogger();
      if (!bVar4) {
        this_03 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[9]>(&local_390,(char (*) [9])0xc6d65c);
        pbVar12 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_390,&stack0xffffffffffffff94);
        pbVar12 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar12,(char (*) [24])" weights. Input bones: ");
        pbVar12 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar12,&local_70);
        pbVar12 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar12,(char (*) [17])". Output bones: ");
        this_04 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar12,(uint *)(vertexWeights.
                                             super__Vector_base<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 9)
                           );
        Formatter::basic_formatter::operator_cast_to_string(&local_218,this_04);
        Logger::info(this_03,&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_390);
      }
      std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&a_2)
      ;
      std::
      vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
      ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                 *)&a_1);
    }
    std::
    vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
    ::~vector((vector<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>,_std::allocator<std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>_>
               *)local_30);
  }
  return;
}

Assistant:

void LimitBoneWeightsProcess::ProcessMesh( aiMesh* pMesh)
{
    if( !pMesh->HasBones())
        return;

    // collect all bone weights per vertex
    typedef std::vector< std::vector< Weight > > WeightsPerVertex;
    WeightsPerVertex vertexWeights( pMesh->mNumVertices);

    // collect all weights per vertex
    for( unsigned int a = 0; a < pMesh->mNumBones; a++)
    {
        const aiBone* bone = pMesh->mBones[a];
        for( unsigned int b = 0; b < bone->mNumWeights; b++)
        {
            const aiVertexWeight& w = bone->mWeights[b];
            vertexWeights[w.mVertexId].push_back( Weight( a, w.mWeight));
        }
    }

    unsigned int removed = 0, old_bones = pMesh->mNumBones;

    // now cut the weight count if it exceeds the maximum
    bool bChanged = false;
    for( WeightsPerVertex::iterator vit = vertexWeights.begin(); vit != vertexWeights.end(); ++vit)
    {
        if( vit->size() <= mMaxWeights)
            continue;

        bChanged = true;

        // more than the defined maximum -> first sort by weight in descending order. That's
        // why we defined the < operator in such a weird way.
        std::sort( vit->begin(), vit->end());

        // now kill everything beyond the maximum count
        unsigned int m = static_cast<unsigned int>(vit->size());
        vit->erase( vit->begin() + mMaxWeights, vit->end());
        removed += static_cast<unsigned int>(m-vit->size());

        // and renormalize the weights
        float sum = 0.0f;
        for( std::vector<Weight>::const_iterator it = vit->begin(); it != vit->end(); ++it ) {
            sum += it->mWeight;
        }
        if( 0.0f != sum ) {
            const float invSum = 1.0f / sum;
            for( std::vector<Weight>::iterator it = vit->begin(); it != vit->end(); ++it ) {
                it->mWeight *= invSum;
            }
        }
    }

    if (bChanged)   {
        // rebuild the vertex weight array for all bones
        typedef std::vector< std::vector< aiVertexWeight > > WeightsPerBone;
        WeightsPerBone boneWeights( pMesh->mNumBones);
        for( unsigned int a = 0; a < vertexWeights.size(); a++)
        {
            const std::vector<Weight>& vw = vertexWeights[a];
            for( std::vector<Weight>::const_iterator it = vw.begin(); it != vw.end(); ++it)
                boneWeights[it->mBone].push_back( aiVertexWeight( a, it->mWeight));
        }

        // and finally copy the vertex weight list over to the mesh's bones
        std::vector<bool> abNoNeed(pMesh->mNumBones,false);
        bChanged = false;

        for( unsigned int a = 0; a < pMesh->mNumBones; a++)
        {
            const std::vector<aiVertexWeight>& bw = boneWeights[a];
            aiBone* bone = pMesh->mBones[a];

            if ( bw.empty() )
            {
                abNoNeed[a] = bChanged = true;
                continue;
            }

            // copy the weight list. should always be less weights than before, so we don't need a new allocation
            ai_assert( bw.size() <= bone->mNumWeights);
            bone->mNumWeights = static_cast<unsigned int>( bw.size() );
            ::memcpy( bone->mWeights, &bw[0], bw.size() * sizeof( aiVertexWeight));
        }

        if (bChanged)   {
            // the number of new bones is smaller than before, so we can reuse the old array
            aiBone** ppcCur = pMesh->mBones;aiBone** ppcSrc = ppcCur;

            for (std::vector<bool>::const_iterator iter  = abNoNeed.begin();iter != abNoNeed.end()  ;++iter)    {
                if (*iter)  {
                    delete *ppcSrc;
                    --pMesh->mNumBones;
                }
                else *ppcCur++ = *ppcSrc;
                ++ppcSrc;
            }
        }

        if (!DefaultLogger::isNullLogger()) {
            ASSIMP_LOG_INFO_F("Removed ", removed, " weights. Input bones: ", old_bones, ". Output bones: ", pMesh->mNumBones );
        }
    }
}